

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void g_canvas_setup(void)

{
  _class *p_Var1;
  t_pd c;
  t_symbol *ptVar2;
  
  ptVar2 = gensym("canvas");
  canvas_class = class_new(ptVar2,(t_newmethod)0x0,canvas_free,0xf8,8,A_NULL);
  c = pd_canvasmaker;
  ptVar2 = gensym("canvas");
  class_addmethod(c,canvas_new,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("restore");
  class_addmethod(p_Var1,canvas_restore,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("coords");
  class_addmethod(p_Var1,canvas_coords,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("obj");
  class_addmethod(p_Var1,canvas_obj,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("msg");
  class_addmethod(p_Var1,canvas_msg,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("floatatom");
  class_addmethod(p_Var1,canvas_floatatom,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("listbox");
  class_addmethod(p_Var1,canvas_listbox,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("symbolatom");
  class_addmethod(p_Var1,canvas_symbolatom,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("text");
  class_addmethod(p_Var1,glist_text,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("graph");
  class_addmethod(p_Var1,glist_glist,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("scalar");
  class_addmethod(p_Var1,glist_scalar,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("connect");
  class_addmethod(p_Var1,canvas_connect,ptVar2,A_FLOAT,1,1,1,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("bng");
  class_addmethod(p_Var1,canvas_bng,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("toggle");
  class_addmethod(p_Var1,canvas_toggle,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("vslider");
  class_addmethod(p_Var1,canvas_vslider,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("hslider");
  class_addmethod(p_Var1,canvas_hslider,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("hdial");
  class_addmethod(p_Var1,canvas_hdial,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("vdial");
  class_addmethod(p_Var1,canvas_vdial,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("hradio");
  class_addmethod(p_Var1,canvas_hradio,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("vradio");
  class_addmethod(p_Var1,canvas_vradio,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("vumeter");
  class_addmethod(p_Var1,canvas_vumeter,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("mycnv");
  class_addmethod(p_Var1,canvas_mycnv,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("numbox");
  class_addmethod(p_Var1,canvas_numbox,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("pop");
  class_addmethod(p_Var1,canvas_pop,ptVar2,A_DEFFLOAT,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("loadbang");
  class_addmethod(p_Var1,canvas_loadbang,ptVar2,A_NULL);
  p_Var1 = canvas_class;
  ptVar2 = gensym("setbounds");
  class_addmethod(p_Var1,canvas_setbounds,ptVar2,A_FLOAT,1,1,1,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("relocate");
  class_addmethod(p_Var1,canvas_relocate,ptVar2,A_SYMBOL,2,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("vis");
  class_addmethod(p_Var1,canvas_vis,ptVar2,A_FLOAT,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("menu-open");
  class_addmethod(p_Var1,glist_menu_open,ptVar2,A_NULL);
  p_Var1 = canvas_class;
  ptVar2 = gensym("map");
  class_addmethod(p_Var1,canvas_map,ptVar2,A_FLOAT,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("dirty");
  class_addmethod(p_Var1,canvas_dirty,ptVar2,A_FLOAT,0);
  class_setpropertiesfn(canvas_class,canvas_properties);
  p_Var1 = canvas_class;
  ptVar2 = gensym("clear");
  class_addmethod(p_Var1,glist_clear,ptVar2,A_NULL);
  ptVar2 = gensym("pd");
  class_addcreator(subcanvas_new,ptVar2,A_DEFSYM,0);
  ptVar2 = gensym("page");
  class_addcreator(subcanvas_new,ptVar2,A_DEFSYM,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("click");
  class_addmethod(p_Var1,canvas_click,ptVar2,A_FLOAT,1,1,1,1,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,canvas_dsp,ptVar2,A_CANT,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("rename");
  class_addmethod(p_Var1,canvas_rename_method,ptVar2,A_GIMME,0);
  ptVar2 = gensym("declare");
  declare_class = class_new(ptVar2,declare_new,declare_free,0x40,8,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("declare");
  class_addmethod(p_Var1,canvas_declare,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("f");
  class_addmethod(p_Var1,canvas_f,ptVar2,A_GIMME,0);
  g_graph_setup();
  g_editor_setup();
  g_readwrite_setup();
  return;
}

Assistant:

void g_canvas_setup(void)
{
        /* we prevent the user from typing "canvas" in an object box
        by sending 0 for a creator function. */
    canvas_class = class_new(gensym("canvas"), 0,
        (t_method)canvas_free, sizeof(t_canvas), CLASS_NOINLET, 0);
            /* here is the real creator function, invoked in patch files
            by sending the "canvas" message to #N, which is bound
            to pd_camvasmaker. */
    class_addmethod(pd_canvasmaker, (t_method)canvas_new, gensym("canvas"),
        A_GIMME, 0);
    class_addmethod(canvas_class, (t_method)canvas_restore,
        gensym("restore"), A_GIMME, 0);
    class_addmethod(canvas_class, (t_method)canvas_coords,
        gensym("coords"), A_GIMME, 0);

/* -------------------------- objects ----------------------------- */
    class_addmethod(canvas_class, (t_method)canvas_obj,
        gensym("obj"), A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_msg,
        gensym("msg"), A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_floatatom,
        gensym("floatatom"), A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_listbox,
        gensym("listbox"), A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_symbolatom,
        gensym("symbolatom"), A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)glist_text,
        gensym("text"), A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)glist_glist, gensym("graph"),
        A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)glist_scalar,
        gensym("scalar"), A_GIMME, A_NULL);

/* -------------- connect method used in reading files ------------------ */
    class_addmethod(canvas_class, (t_method)canvas_connect,
        gensym("connect"), A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_NULL);


/* -------------- IEMGUI: button, toggle, slider, etc.  ------------ */
    class_addmethod(canvas_class, (t_method)canvas_bng, gensym("bng"),
                    A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_toggle, gensym("toggle"),
                    A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_vslider, gensym("vslider"),
                    A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_hslider, gensym("hslider"),
                    A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_hdial, gensym("hdial"),
                    A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_vdial, gensym("vdial"),
                    A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_hradio, gensym("hradio"),
                    A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_vradio, gensym("vradio"),
                    A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_vumeter, gensym("vumeter"),
                    A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_mycnv, gensym("mycnv"),
                    A_GIMME, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_numbox, gensym("numbox"),
                    A_GIMME, A_NULL);

/* ------------------------ gui stuff --------------------------- */
    class_addmethod(canvas_class, (t_method)canvas_pop, gensym("pop"),
        A_DEFFLOAT, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_loadbang,
        gensym("loadbang"), A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_setbounds,
        gensym("setbounds"), A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_relocate,
        gensym("relocate"), A_SYMBOL, A_SYMBOL, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_vis,
        gensym("vis"), A_FLOAT, A_NULL);
    class_addmethod(canvas_class, (t_method)glist_menu_open,
        gensym("menu-open"), A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_map,
        gensym("map"), A_FLOAT, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_dirty,
        gensym("dirty"), A_FLOAT, A_NULL);
    class_setpropertiesfn(canvas_class, canvas_properties);

/* ---------------------- list handling ------------------------ */
    class_addmethod(canvas_class, (t_method)glist_clear, gensym("clear"),
        A_NULL);

/* ----- subcanvases, which you get by typing "pd" in a box ---- */
    class_addcreator((t_newmethod)subcanvas_new, gensym("pd"), A_DEFSYMBOL, 0);
    class_addcreator((t_newmethod)subcanvas_new, gensym("page"),  A_DEFSYMBOL, 0);

    class_addmethod(canvas_class, (t_method)canvas_click,
        gensym("click"), A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, 0);
    class_addmethod(canvas_class, (t_method)canvas_dsp,
        gensym("dsp"), A_CANT, 0);
    class_addmethod(canvas_class, (t_method)canvas_rename_method,
        gensym("rename"), A_GIMME, 0);

/*---------------------------- declare ------------------- */
    declare_class = class_new(gensym("declare"), (t_newmethod)declare_new,
        (t_method)declare_free, sizeof(t_declare), CLASS_NOINLET, A_GIMME, 0);
    class_addmethod(canvas_class, (t_method)canvas_declare,
        gensym("declare"), A_GIMME, 0);

/*--------------- future message to set formatting  -------------- */
    class_addmethod(canvas_class, (t_method)canvas_f,
        gensym("f"), A_GIMME, 0);
/* -------------- setups from other files for canvas_class ---------------- */
    g_graph_setup();
    g_editor_setup();
    g_readwrite_setup();
}